

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::GenUnionObject(RustGenerator *this,EnumDef *enum_def)

{
  IdlNamer *pIVar1;
  CodeWriter *this_00;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"ENUM_TY",&local_3c1);
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_3a0,pIVar1,enum_def);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_3c0,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"ENUM_FN",&local_3c1);
  (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_3a0,pIVar1,enum_def);
  CodeWriter::SetValue(this_00,&local_3c0,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"ENUM_OTY",&local_3c1);
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_3a0,pIVar1,enum_def);
  CodeWriter::SetValue(this_00,&local_3c0,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"#[allow(clippy::upper_case_acronyms)]",
             (allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"#[non_exhaustive]",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"#[derive(Debug, Clone, PartialEq)]",(allocator<char> *)&local_3c0
            );
  CodeWriter::operator+=(this_00,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"{{ACCESS_TYPE}} enum {{ENUM_OTY}} {",
             (allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"  NONE,",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:964:52)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:964:52)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  ForAllUnionObjectVariantsBesidesNone(this,enum_def,(function<void_()> *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"}",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"impl Default for {{ENUM_OTY}} {",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"  fn default() -> Self {",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"    Self::NONE",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"  }",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"}",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"impl {{ENUM_OTY}} {",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"  pub fn {{ENUM_FN}}_type(&self) -> {{ENUM_TY}} {",
             (allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"    match self {",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"      Self::NONE => {{ENUM_TY}}::NONE,",
             (allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:983:52)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:983:52)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  ForAllUnionObjectVariantsBesidesNone(this,enum_def,(function<void_()> *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"    }",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"  }",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "  pub fn pack<\'b, A: flatbuffers::Allocator + \'b>(&self, fbb: &mut flatbuffers::FlatBufferBuilder<\'b, A>) -> Option<flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>> {"
             ,(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"    match self {",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"      Self::NONE => None,",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:998:52)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:998:52)>
             ::_M_manager;
  local_80._M_unused._M_object = this;
  ForAllUnionObjectVariantsBesidesNone(this,enum_def,(function<void_()> *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"    }",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"  }",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  local_a0._8_8_ = 0;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:1006:52)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:1006:52)>
             ::_M_manager;
  local_a0._M_unused._M_object = this;
  ForAllUnionObjectVariantsBesidesNone(this,enum_def,(function<void_()> *)&local_a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"}",(allocator<char> *)&local_3c0);
  CodeWriter::operator+=(this_00,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  return;
}

Assistant:

void GenUnionObject(const EnumDef &enum_def) {
    code_.SetValue("ENUM_TY", namer_.Type(enum_def));
    code_.SetValue("ENUM_FN", namer_.Function(enum_def));
    code_.SetValue("ENUM_OTY", namer_.ObjectType(enum_def));

    // Generate native union.
    code_ += "#[allow(clippy::upper_case_acronyms)]";  // NONE's spelling is
                                                       // intended.
    code_ += "#[non_exhaustive]";
    code_ += "#[derive(Debug, Clone, PartialEq)]";
    code_ += "{{ACCESS_TYPE}} enum {{ENUM_OTY}} {";
    code_ += "  NONE,";
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      code_ += "{{NATIVE_VARIANT}}(Box<{{U_ELEMENT_TABLE_TYPE}}>),";
    });
    code_ += "}";
    // Generate Default (NONE).
    code_ += "impl Default for {{ENUM_OTY}} {";
    code_ += "  fn default() -> Self {";
    code_ += "    Self::NONE";
    code_ += "  }";
    code_ += "}";

    // Generate native union methods.
    code_ += "impl {{ENUM_OTY}} {";

    // Get flatbuffers union key.
    // TODO(cneo): add docstrings?
    code_ += "  pub fn {{ENUM_FN}}_type(&self) -> {{ENUM_TY}} {";
    code_ += "    match self {";
    code_ += "      Self::NONE => {{ENUM_TY}}::NONE,";
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      code_ +=
          "    Self::{{NATIVE_VARIANT}}(_) => {{ENUM_TY}}::"
          "{{VARIANT_NAME}},";
    });
    code_ += "    }";
    code_ += "  }";
    // Pack flatbuffers union value
    code_ +=
        "  pub fn pack<'b, A: flatbuffers::Allocator + 'b>(&self, fbb: &mut "
        "flatbuffers::FlatBufferBuilder<'b, A>)"
        " -> Option<flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>>"
        " {";
    code_ += "    match self {";
    code_ += "      Self::NONE => None,";
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      code_ += "    Self::{{NATIVE_VARIANT}}(v) => \\";
      code_ += "Some(v.pack(fbb).as_union_value()),";
    });
    code_ += "    }";
    code_ += "  }";

    // Generate some accessors;
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      // Move accessor.
      code_ +=
          "/// If the union variant matches, return the owned "
          "{{U_ELEMENT_TABLE_TYPE}}, setting the union to NONE.";
      code_ +=
          "pub fn take_{{U_ELEMENT_NAME}}(&mut self) -> "
          "Option<Box<{{U_ELEMENT_TABLE_TYPE}}>> {";
      code_ += "  if let Self::{{NATIVE_VARIANT}}(_) = self {";
      code_ += "    let v = core::mem::replace(self, Self::NONE);";
      code_ += "    if let Self::{{NATIVE_VARIANT}}(w) = v {";
      code_ += "      Some(w)";
      code_ += "    } else {";
      code_ += "      unreachable!()";
      code_ += "    }";
      code_ += "  } else {";
      code_ += "    None";
      code_ += "  }";
      code_ += "}";
      // Immutable reference accessor.
      code_ +=
          "/// If the union variant matches, return a reference to the "
          "{{U_ELEMENT_TABLE_TYPE}}.";
      code_ +=
          "pub fn as_{{U_ELEMENT_NAME}}(&self) -> "
          "Option<&{{U_ELEMENT_TABLE_TYPE}}> {";
      code_ +=
          "  if let Self::{{NATIVE_VARIANT}}(v) = self "
          "{ Some(v.as_ref()) } else { None }";
      code_ += "}";
      // Mutable reference accessor.
      code_ +=
          "/// If the union variant matches, return a mutable reference"
          " to the {{U_ELEMENT_TABLE_TYPE}}.";
      code_ +=
          "pub fn as_{{U_ELEMENT_NAME}}_mut(&mut self) -> "
          "Option<&mut {{U_ELEMENT_TABLE_TYPE}}> {";
      code_ +=
          "  if let Self::{{NATIVE_VARIANT}}(v) = self "
          "{ Some(v.as_mut()) } else { None }";
      code_ += "}";
    });
    code_ += "}";  // End union methods impl.
  }